

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *__stream;
  char filename [46];
  char acStack_48 [56];
  
  pFVar2 = tmpfile();
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x76,"( fh = tmpfile() ) != NULL");
  }
  iVar1 = fputc(0x78,pFVar2);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x77,"fputc( \'x\', fh ) == \'x\'");
  }
  strcpy(acStack_48,*(char **)&pFVar2->_fileno);
  __stream = fopen(acStack_48,"r");
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7a,"( fhtest = fopen( filename, \"r\" ) ) != ((void *)0)");
  }
  iVar1 = fclose(__stream);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7b,"fclose( fhtest ) == 0");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7d,"fclose( fh ) == 0");
  }
  pFVar2 = fopen(acStack_48,"r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7f,"fopen( filename, \"r\" ) == ((void *)0)");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
#ifndef REGTEST
    char filename[ L_tmpnam ];
    FILE * fhtest;
#endif
    TESTCASE( ( fh = tmpfile() ) != NULL );
    TESTCASE( fputc( 'x', fh ) == 'x' );
    /* Checking that file is actually there */
    TESTCASE_NOREG( strcpy( filename, fh->filename ) == filename );
    TESTCASE_NOREG( ( fhtest = fopen( filename, "r" ) ) != NULL );
    TESTCASE_NOREG( fclose( fhtest ) == 0 );
    /* Closing tmpfile */
    TESTCASE( fclose( fh ) == 0 );
    /* Checking that file was deleted */
    TESTCASE_NOREG( fopen( filename, "r" ) == NULL );
    return TEST_RESULTS;
}